

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

char * __thiscall cmGeneratorTarget::GetProperty(cmGeneratorTarget *this,string *prop)

{
  TargetType tgtType;
  bool bVar1;
  cmMessenger *pcVar2;
  cmListFileBacktrace *pcVar3;
  char *pcVar4;
  cmListFileBacktrace cStack_48;
  
  tgtType = this->Target->TargetTypeValue;
  pcVar2 = cmMakefile::GetMessenger(this->Makefile);
  pcVar3 = cmTarget::GetBacktrace(this->Target);
  cmListFileBacktrace::cmListFileBacktrace(&cStack_48,pcVar3);
  bVar1 = cmTargetPropertyComputer::PassesWhitelist(tgtType,prop,pcVar2,&cStack_48);
  cmListFileBacktrace::~cmListFileBacktrace(&cStack_48);
  if (bVar1) {
    pcVar2 = cmMakefile::GetMessenger(this->Makefile);
    pcVar3 = cmTarget::GetBacktrace(this->Target);
    cmListFileBacktrace::cmListFileBacktrace(&cStack_48,pcVar3);
    pcVar4 = cmTargetPropertyComputer::GetProperty<cmGeneratorTarget>(this,prop,pcVar2,&cStack_48);
    cmListFileBacktrace::~cmListFileBacktrace(&cStack_48);
    if (pcVar4 != (char *)0x0) {
      return pcVar4;
    }
    if ((cmSystemTools::s_FatalErrorOccured == false) &&
       (bVar1 = cmSystemTools::GetInterruptFlag(), !bVar1)) {
      pcVar4 = cmTarget::GetProperty(this->Target,prop);
      return pcVar4;
    }
  }
  return (char *)0x0;
}

Assistant:

const char* cmGeneratorTarget::GetProperty(const std::string& prop) const
{
  if (!cmTargetPropertyComputer::PassesWhitelist(
        this->GetType(), prop, this->Makefile->GetMessenger(),
        this->GetBacktrace())) {
    return CM_NULLPTR;
  }
  if (const char* result = cmTargetPropertyComputer::GetProperty(
        this, prop, this->Makefile->GetMessenger(), this->GetBacktrace())) {
    return result;
  }
  if (cmSystemTools::GetFatalErrorOccured()) {
    return CM_NULLPTR;
  }
  return this->Target->GetProperty(prop);
}